

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utf8SourceInfo.cpp
# Opt level: O2

void __thiscall
Js::Utf8SourceInfo::GetLineInfoForCharPosition
          (Utf8SourceInfo *this,charcount_t charPosition,charcount_t *outLineNumber,
          charcount_t *outColumn,charcount_t *outLineByteOffset,bool allowSlowLookup)

{
  LineOffsetCache *this_00;
  code *pcVar1;
  bool bVar2;
  charcount_t cVar3;
  undefined4 *puVar4;
  LPCUTF8 puVar5;
  size_t sVar6;
  long lVar7;
  charcount_t local_54;
  LPCUTF8 puStack_50;
  charcount_t byteStartOffset;
  LPCUTF8 sourceAfterBOM;
  charcount_t *local_40;
  charcount_t local_34 [2];
  charcount_t lineCharOffset;
  
  if ((this->m_lineOffsetCache).ptr == (LineOffsetCache *)0x0 && !allowSlowLookup) {
    AssertCount = AssertCount + 1;
    local_40 = outLineByteOffset;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x125,"(this->m_lineOffsetCache != nullptr || allowSlowLookup)",
                                "LineOffsetCache wasn\'t created, EnsureLineOffsetCache should have been called."
                               );
    if (!bVar2) goto LAB_00729e2e;
    *puVar4 = 0;
    outLineByteOffset = local_40;
  }
  local_40 = outLineNumber;
  if ((outColumn == (charcount_t *)0x0 || outLineNumber == (charcount_t *)0x0) ||
      outLineByteOffset == (charcount_t *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x126,
                                "(outLineNumber != nullptr && outColumn != nullptr && outLineByteOffset != nullptr)"
                                ,"Expected out parameter\'s can\'t be a nullptr.");
    if (!bVar2) goto LAB_00729e2e;
    *puVar4 = 0;
  }
  local_34[0] = 0;
  this_00 = (this->m_lineOffsetCache).ptr;
  if (this_00 == (LineOffsetCache *)0x0) {
    sourceAfterBOM = (LPCUTF8)outColumn;
    puVar5 = GetSource(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
    sVar6 = GetCbLength(this,L"Utf8SourceInfo::AllocateLineOffsetCache");
    puStack_50 = puVar5;
    local_34[0] = FunctionBody::SkipByteOrderMark(&stack0xffffffffffffffb0);
    lVar7 = (long)puStack_50 - (long)puVar5;
    if (0xfffffffe < lVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                  ,0x131,
                                  "((sourceAfterBOM - sourceStart) < ((uint32_t)~((uint32_t)0)))",
                                  "(sourceAfterBOM - sourceStart) < MAXUINT32");
      if (!bVar2) goto LAB_00729e2e;
      *puVar4 = 0;
      lVar7 = (long)puStack_50 - (long)puVar5;
    }
    local_54 = (charcount_t)lVar7;
    cVar3 = LineOffsetCache::FindLineForCharacterOffset
                      (puStack_50,puVar5 + sVar6,local_34,&local_54,charPosition);
    *outLineByteOffset = local_54;
    outColumn = (charcount_t *)sourceAfterBOM;
  }
  else {
    cVar3 = LineOffsetCache::GetLineForCharacterOffset
                      (this_00,charPosition,local_34,outLineByteOffset);
  }
  if (charPosition < local_34[0]) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/Utf8SourceInfo.cpp"
                                ,0x13d,"(charPosition >= lineCharOffset)",
                                "charPosition >= lineCharOffset");
    if (!bVar2) {
LAB_00729e2e:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  *local_40 = cVar3;
  *outColumn = charPosition - local_34[0];
  return;
}

Assistant:

void Utf8SourceInfo::GetLineInfoForCharPosition(charcount_t charPosition, charcount_t *outLineNumber, charcount_t *outColumn, charcount_t *outLineByteOffset, bool allowSlowLookup)
    {
        AssertMsg(this->m_lineOffsetCache != nullptr || allowSlowLookup, "LineOffsetCache wasn't created, EnsureLineOffsetCache should have been called.");
        AssertMsg(outLineNumber != nullptr && outColumn != nullptr && outLineByteOffset != nullptr, "Expected out parameter's can't be a nullptr.");

        charcount_t lineCharOffset = 0;
        int line = 0;
        if (this->m_lineOffsetCache == nullptr)
        {
            LPCUTF8 sourceStart = this->GetSource(_u("Utf8SourceInfo::AllocateLineOffsetCache"));
            LPCUTF8 sourceEnd = sourceStart + this->GetCbLength(_u("Utf8SourceInfo::AllocateLineOffsetCache"));

            LPCUTF8 sourceAfterBOM = sourceStart;
            lineCharOffset = FunctionBody::SkipByteOrderMark(sourceAfterBOM /* byref */);
            Assert((sourceAfterBOM - sourceStart) < MAXUINT32);
            charcount_t byteStartOffset = (charcount_t)(sourceAfterBOM - sourceStart);

            line = LineOffsetCache::FindLineForCharacterOffset(sourceAfterBOM, sourceEnd, lineCharOffset, byteStartOffset, charPosition);

            *outLineByteOffset = byteStartOffset;
        }
        else
        {
            line = this->m_lineOffsetCache->GetLineForCharacterOffset(charPosition, &lineCharOffset, outLineByteOffset);
        }

        Assert(charPosition >= lineCharOffset);

        *outLineNumber = line;
        *outColumn = charPosition - lineCharOffset;
    }